

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

void scalar_mult(scalar *out,scalar *lhs,scalar *rhs)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint16_t uVar7;
  uint32_t img_real;
  uint32_t real_img;
  uint32_t img_img;
  uint32_t real_real;
  int i;
  scalar *rhs_local;
  scalar *lhs_local;
  scalar *out_local;
  
  for (img_img = 0; (int)img_img < 0x80; img_img = img_img + 1) {
    uVar1 = lhs->c[(int)(img_img << 1)];
    uVar2 = rhs->c[(int)(img_img << 1)];
    uVar3 = lhs->c[(int)(img_img << 1)];
    uVar4 = rhs->c[(int)(img_img * 2 + 1)];
    uVar5 = lhs->c[(int)(img_img * 2 + 1)];
    uVar6 = rhs->c[(int)(img_img << 1)];
    uVar7 = reduce((uint)lhs->c[(int)(img_img * 2 + 1)] * (uint)rhs->c[(int)(img_img * 2 + 1)]);
    uVar7 = reduce((uint)uVar1 * (uint)uVar2 + (uint)uVar7 * (uint)kModRoots[(int)img_img]);
    out->c[(int)(img_img << 1)] = uVar7;
    uVar7 = reduce((uint)uVar5 * (uint)uVar6 + (uint)uVar3 * (uint)uVar4);
    out->c[(int)(img_img * 2 + 1)] = uVar7;
  }
  return;
}

Assistant:

static void scalar_mult(scalar *out, const scalar *lhs, const scalar *rhs) {
  for (int i = 0; i < DEGREE / 2; i++) {
    uint32_t real_real = (uint32_t)lhs->c[2 * i] * rhs->c[2 * i];
    uint32_t img_img = (uint32_t)lhs->c[2 * i + 1] * rhs->c[2 * i + 1];
    uint32_t real_img = (uint32_t)lhs->c[2 * i] * rhs->c[2 * i + 1];
    uint32_t img_real = (uint32_t)lhs->c[2 * i + 1] * rhs->c[2 * i];
    out->c[2 * i] =
        reduce(real_real + (uint32_t)reduce(img_img) * kModRoots[i]);
    out->c[2 * i + 1] = reduce(img_real + real_img);
  }
}